

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_value_constructor_Test::TestBody(ObjectTest_basic_value_constructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  longlong lhs;
  Message *this_00;
  AssertHelper local_cf0 [8];
  Message local_ce8 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_ce0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_cc0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_ca0;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar_14;
  AssertHelper local_c50 [8];
  Message local_c48 [15];
  bool local_c39;
  undefined1 local_c38 [8];
  AssertionResult gtest_ar__14;
  undefined1 local_c18 [8];
  object obj_1;
  AssertHelper local_bd0 [8];
  Message local_bc8 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_bc0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_ba0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_b80;
  undefined1 local_b60 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_b30 [8];
  Message local_b28 [15];
  bool local_b19;
  undefined1 local_b18 [8];
  AssertionResult gtest_ar__13;
  object obj;
  Message local_ac0 [8];
  vector<jessilib::object,_std::allocator<jessilib::object>_> local_ab8;
  vector<jessilib::object,_std::allocator<jessilib::object>_> local_a98;
  vector<jessilib::object,_std::allocator<jessilib::object>_> local_a78;
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_a30 [8];
  Message local_a28 [15];
  bool local_a19;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar__12;
  undefined1 local_9e8 [8];
  object test_object___12;
  AssertHelper local_9a0 [8];
  Message local_998 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_990;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_970;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_950;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_900 [8];
  Message local_8f8 [15];
  bool local_8e9;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar__11;
  undefined1 local_8b8 [8];
  object test_object___11;
  Message local_870 [8];
  longdouble local_868;
  longdouble local_858;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_810 [8];
  Message local_808 [15];
  Message local_7f9;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar__10;
  undefined1 local_7d8 [8];
  object test_object___10;
  Message local_790 [8];
  double local_788;
  double local_780;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_748 [8];
  Message local_740 [15];
  bool local_731;
  undefined1 local_730 [8];
  AssertionResult gtest_ar__9;
  undefined1 local_718 [8];
  object test_object___9;
  AssertHelper local_6d0 [8];
  Message local_6c8 [8];
  float local_6c0;
  float local_6bc;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_688 [8];
  Message local_680 [15];
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__8;
  undefined1 local_658 [8];
  object test_object___8;
  Message local_610 [8];
  long local_608;
  long local_600;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_5c8 [8];
  Message local_5c0 [15];
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__7;
  undefined1 local_598 [8];
  object test_object___7;
  Message local_550 [8];
  undefined1 local_548 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_518 [8];
  Message local_510 [15];
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__6;
  undefined1 local_4e8 [8];
  object test_object___6;
  Message local_4a0 [8];
  long local_498;
  long local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_458 [8];
  Message local_450 [15];
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_428 [8];
  object test_object___5;
  AssertHelper local_3e0 [8];
  Message local_3d8 [8];
  int local_3d0;
  int local_3cc;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_398 [8];
  Message local_390 [15];
  bool local_381;
  undefined1 local_380 [8];
  AssertionResult gtest_ar__4;
  undefined1 local_368 [8];
  object test_object___4;
  AssertHelper local_320 [8];
  Message local_318 [12];
  short local_30c;
  short local_30a;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_2d8 [8];
  Message local_2d0 [15];
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_2a8 [8];
  object test_object___3;
  AssertHelper local_260 [8];
  Message local_258 [14];
  uchar local_24a;
  uchar local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_218 [8];
  Message local_210 [15];
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_1e8 [8];
  object test_object___2;
  AssertHelper local_1a0 [8];
  Message local_198 [14];
  char local_18a;
  char local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_158 [8];
  Message local_150 [15];
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_128 [8];
  object test_object___1;
  AssertHelper local_e0 [8];
  Message local_d8 [14];
  bool local_ca;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_98 [8];
  Message local_90 [31];
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  undefined1 local_58 [8];
  object test_object__;
  ObjectTest_basic_value_constructor_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0;
  jessilib::object::object<bool,_nullptr>
            ((object *)local_58,
             (bool *)((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
  local_71 = jessilib::object::has<bool>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_70,"test_object__ .has< bool >()","false"
              );
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x157,pcVar2);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_c9 = jessilib::object::get<bool,_nullptr>((object *)local_58,false);
  local_ca = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_c8,"test_object__.get< bool >()","bool {}",&local_c9,&local_ca);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x157,pcVar2);
    testing::internal::AssertHelper::operator=(local_e0,local_d8);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    testing::Message::~Message(local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  jessilib::object::~object((object *)local_58);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0;
  jessilib::object::object<signed_char,_nullptr>
            ((object *)local_128,
             (char *)((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
  local_141 = jessilib::object::has<signed_char>((object *)local_128);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_140,
               "test_object__ .has< signed_char_t >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=(local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_189 = jessilib::object::get<signed_char,_nullptr>((object *)local_128,'\0');
  local_18a = '\0';
  testing::internal::EqHelper::Compare<signed_char,_signed_char,_nullptr>
            ((EqHelper *)local_188,"test_object__.get< signed_char_t >()","signed_char_t {}",
             &local_189,&local_18a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              (local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=(local_1a0,local_198);
    testing::internal::AssertHelper::~AssertHelper(local_1a0);
    testing::Message::~Message(local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  jessilib::object::~object((object *)local_128);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0;
  jessilib::object::object<unsigned_char,_nullptr>
            ((object *)local_1e8,
             (uchar *)((long)&gtest_ar__2.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 7));
  local_201 = jessilib::object::has<unsigned_char>((object *)local_1e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_200,&local_201,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_200,
               "test_object__ .has< unsigned_char_t >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x159,pcVar2);
    testing::internal::AssertHelper::operator=(local_218,local_210);
    testing::internal::AssertHelper::~AssertHelper(local_218);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_249 = jessilib::object::get<unsigned_char,_nullptr>((object *)local_1e8,'\0');
  local_24a = '\0';
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
            ((EqHelper *)local_248,"test_object__.get< unsigned_char_t >()","unsigned_char_t {}",
             &local_249,&local_24a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x159,pcVar2);
    testing::internal::AssertHelper::operator=(local_260,local_258);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    testing::Message::~Message(local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  jessilib::object::~object((object *)local_1e8);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_2_ = 0;
  jessilib::object::object<short,_nullptr>
            ((object *)local_2a8,
             (short *)((long)&gtest_ar__3.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 6));
  local_2c1 = jessilib::object::has<short>((object *)local_2a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c0,&local_2c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_3.message_,local_2c0,"test_object__ .has< short >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15a,pcVar2);
    testing::internal::AssertHelper::operator=(local_2d8,local_2d0);
    testing::internal::AssertHelper::~AssertHelper(local_2d8);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  local_30a = jessilib::object::get<short,_nullptr>((object *)local_2a8,0);
  local_30c = 0;
  testing::internal::EqHelper::Compare<short,_short,_nullptr>
            ((EqHelper *)local_308,"test_object__.get< short >()","short {}",&local_30a,&local_30c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              (local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15a,pcVar2);
    testing::internal::AssertHelper::operator=(local_320,local_318);
    testing::internal::AssertHelper::~AssertHelper(local_320);
    testing::Message::~Message(local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  jessilib::object::~object((object *)local_2a8);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  jessilib::object::object<int,_nullptr>
            ((object *)local_368,
             (int *)((long)&gtest_ar__4.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_381 = jessilib::object::has<int>((object *)local_368);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_380,&local_381,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_4.message_,local_380,"test_object__ .has< int >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=(local_398,local_390);
    testing::internal::AssertHelper::~AssertHelper(local_398);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  local_3cc = jessilib::object::get<int,_nullptr>((object *)local_368,0);
  local_3d0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3c8,"test_object__.get< int >()","int {}",&local_3cc,&local_3d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              (local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=(local_3e0,local_3d8);
    testing::internal::AssertHelper::~AssertHelper(local_3e0);
    testing::Message::~Message(local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  jessilib::object::~object((object *)local_368);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jessilib::object::object<long,_nullptr>((object *)local_428,(long *)&gtest_ar__5.message_);
  local_441 = jessilib::object::has<long>((object *)local_428);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,&local_441,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_5.message_,local_440,"test_object__ .has< long >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15c,pcVar2);
    testing::internal::AssertHelper::operator=(local_458,local_450);
    testing::internal::AssertHelper::~AssertHelper(local_458);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_490 = jessilib::object::get<long,_nullptr>((object *)local_428,0);
  local_498 = 0;
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_488,"test_object__.get< long >()","long {}",&local_490,&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&test_object___6.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&test_object___6.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),local_4a0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&test_object___6.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38));
    testing::Message::~Message(local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  jessilib::object::~object((object *)local_428);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jessilib::object::object<long_long,_nullptr>
            ((object *)local_4e8,(longlong *)&gtest_ar__6.message_);
  local_501 = jessilib::object::has<long_long>((object *)local_4e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_500,&local_501,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(local_510);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_6.message_,local_500,
               "test_object__ .has< long_long_t >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15d,pcVar2);
    testing::internal::AssertHelper::operator=(local_518,local_510);
    testing::internal::AssertHelper::~AssertHelper(local_518);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  lhs = jessilib::object::get<long_long,_nullptr>((object *)local_4e8,0);
  testing::internal::EqHelper::Compare
            ((EqHelper *)local_548,"test_object__.get< long_long_t >()","long_long_t {}",lhs,0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&test_object___7.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&test_object___7.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),local_550);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&test_object___7.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38));
    testing::Message::~Message(local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  jessilib::object::~object((object *)local_4e8);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jessilib::object::object<long,_nullptr>((object *)local_598,(long *)&gtest_ar__7.message_);
  local_5b1 = jessilib::object::has<long>((object *)local_598);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_7.message_,local_5b0,"test_object__ .has< intmax_t >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=(local_5c8,local_5c0);
    testing::internal::AssertHelper::~AssertHelper(local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  local_600 = jessilib::object::get<long,_nullptr>((object *)local_598,0);
  local_608 = 0;
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_5f8,"test_object__.get< intmax_t >()","intmax_t {}",&local_600,
             &local_608);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(local_610);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&test_object___8.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&test_object___8.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),local_610);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&test_object___8.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38));
    testing::Message::~Message(local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  jessilib::object::~object((object *)local_598);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  jessilib::object::object<float,_nullptr>
            ((object *)local_658,
             (float *)((long)&gtest_ar__8.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 4));
  local_671 = jessilib::object::has<float>((object *)local_658);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_670,&local_671,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(local_680);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_8.message_,local_670,"test_object__ .has< float >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=(local_688,local_680);
    testing::internal::AssertHelper::~AssertHelper(local_688);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_6bc = jessilib::object::get<float,_nullptr>((object *)local_658,0.0);
  local_6c0 = 0.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_6b8,"test_object__.get< float >()","float {}",&local_6bc,&local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
    testing::internal::AssertHelper::AssertHelper
              (local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=(local_6d0,local_6c8);
    testing::internal::AssertHelper::~AssertHelper(local_6d0);
    testing::Message::~Message(local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  jessilib::object::~object((object *)local_658);
  gtest_ar__9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jessilib::object::object<double,_nullptr>((object *)local_718,(double *)&gtest_ar__9.message_);
  local_731 = jessilib::object::has<double>((object *)local_718);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_730,&local_731,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(local_740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_9.message_,local_730,"test_object__ .has< double >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=(local_748,local_740);
    testing::internal::AssertHelper::~AssertHelper(local_748);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  local_780 = jessilib::object::get<double,_nullptr>((object *)local_718,0.0);
  local_788 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_778,"test_object__.get< double >()","double {}",&local_780,&local_788
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(local_790);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&test_object___10.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&test_object___10.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),local_790);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&test_object___10.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38));
    testing::Message::~Message(local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  jessilib::object::~object((object *)local_718);
  unique0x00076c00 = (longdouble)0;
  jessilib::object::object<long_double,_nullptr>
            ((object *)local_7d8,(longdouble *)&gtest_ar__10.message_);
  local_7f9 = (Message)jessilib::object::has<long_double>((object *)local_7d8);
  this_00 = &local_7f9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7f8,(bool *)this_00,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar1) {
    testing::Message::Message(local_808);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_10.message_,local_7f8,
               "test_object__ .has< long_double_t >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x161,pcVar2);
    this_00 = local_808;
    testing::internal::AssertHelper::operator=(local_810,this_00);
    testing::internal::AssertHelper::~AssertHelper(local_810);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  jessilib::object::get<long_double,_nullptr>
            ((longdouble *)local_7d8,(object *)this_00,(longdouble)0);
  local_868 = (longdouble)0;
  testing::internal::EqHelper::Compare<long_double,_long_double,_nullptr>
            ((EqHelper *)local_840,"test_object__.get< long_double_t >()","long_double_t {}",
             &local_858,&local_868);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(local_870);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&test_object___11.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x161,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&test_object___11.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),local_870);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&test_object___11.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38));
    testing::Message::~Message(local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  jessilib::object::~object((object *)local_7d8);
  std::__cxx11::u8string::u8string((u8string *)&gtest_ar__11.message_);
  jessilib::object::
  object<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((object *)local_8b8,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &gtest_ar__11.message_);
  std::__cxx11::u8string::~u8string((u8string *)&gtest_ar__11.message_);
  local_8e9 = jessilib::object::has<std::__cxx11::u8string>((object *)local_8b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8e8,&local_8e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(local_8f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_11.message_,local_8e8,
               "test_object__ .has< std::u8string >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x162,pcVar2);
    testing::internal::AssertHelper::operator=(local_900,local_8f8);
    testing::internal::AssertHelper::~AssertHelper(local_900);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  std::__cxx11::u8string::u8string((u8string *)&local_970);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_950,(object *)local_8b8,&local_970);
  std::__cxx11::u8string::u8string((u8string *)&local_990);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((EqHelper *)local_930,"test_object__.get< std::u8string >()","std::u8string {}",
             &local_950,&local_990);
  std::__cxx11::u8string::~u8string((u8string *)&local_990);
  std::__cxx11::u8string::~u8string((u8string *)&local_950);
  std::__cxx11::u8string::~u8string((u8string *)&local_970);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(local_998);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              (local_9a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x162,pcVar2);
    testing::internal::AssertHelper::operator=(local_9a0,local_998);
    testing::internal::AssertHelper::~AssertHelper(local_9a0);
    testing::Message::~Message(local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  jessilib::object::~object((object *)local_8b8);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar__12.message_);
  jessilib::object::
  object<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_9e8,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar__12.message_);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar__12.message_);
  local_a19 = jessilib::object::has<std::vector<jessilib::object,std::allocator<jessilib::object>>>
                        ((object *)local_9e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a18,&local_a19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
  if (!bVar1) {
    testing::Message::Message(local_a28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_12.message_,local_a18,
               "test_object__ .has< object::array_type >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=(local_a30,local_a28);
    testing::internal::AssertHelper::~AssertHelper(local_a30);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(local_a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
  local_a98.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a98.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a98.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector(&local_a98);
  jessilib::object::get<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            (&local_a78,(object *)local_9e8,&local_a98);
  local_ab8.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ab8.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ab8.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector(&local_ab8);
  testing::internal::EqHelper::
  Compare<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((EqHelper *)local_a60,"test_object__.get< object::array_type >()",
             "object::array_type {}",&local_a78,&local_ab8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&local_ab8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&local_a78);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&local_a98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
  if (!bVar1) {
    testing::Message::Message(local_ac0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&obj.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&obj.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),local_ac0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&obj.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38));
    testing::Message::~Message(local_ac0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
  jessilib::object::~object((object *)local_9e8);
  jessilib::object::object((object *)&gtest_ar__13.message_,"");
  local_b19 = jessilib::object::has<std::__cxx11::u8string>((object *)&gtest_ar__13.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b18,&local_b19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
  if (!bVar1) {
    testing::Message::Message(local_b28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_13.message_,local_b18,"obj.has<std::u8string>()","false"
              );
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_13.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_b30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=(local_b30,local_b28);
    testing::internal::AssertHelper::~AssertHelper(local_b30);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(local_b28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
  std::__cxx11::u8string::u8string((u8string *)&local_ba0);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_b80,(object *)&gtest_ar__13.message_,&local_ba0);
  std::__cxx11::u8string::u8string((u8string *)&local_bc0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((EqHelper *)local_b60,"obj.get<std::u8string>()","std::u8string{}",&local_b80,
             &local_bc0);
  std::__cxx11::u8string::~u8string((u8string *)&local_bc0);
  std::__cxx11::u8string::~u8string((u8string *)&local_b80);
  std::__cxx11::u8string::~u8string((u8string *)&local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b60);
  if (!bVar1) {
    testing::Message::Message(local_bc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b60);
    testing::internal::AssertHelper::AssertHelper
              (local_bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x169,pcVar2);
    testing::internal::AssertHelper::operator=(local_bd0,local_bc8);
    testing::internal::AssertHelper::~AssertHelper(local_bd0);
    testing::Message::~Message(local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b60);
  jessilib::object::~object((object *)&gtest_ar__13.message_);
  join_0x00000010_0x00000000_ = sv("",0);
  jessilib::object::object((object *)local_c18,(basic_string_view *)&gtest_ar__14.message_);
  local_c39 = jessilib::object::has<std::__cxx11::u8string>((object *)local_c18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c38,&local_c39,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c38);
  if (!bVar1) {
    testing::Message::Message(local_c48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_14.message_,local_c38,"obj.has<std::u8string>()","false"
              );
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_14.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_c50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x16f,pcVar2);
    testing::internal::AssertHelper::operator=(local_c50,local_c48);
    testing::internal::AssertHelper::~AssertHelper(local_c50);
    std::__cxx11::string::~string((string *)&gtest_ar_14.message_);
    testing::Message::~Message(local_c48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c38);
  std::__cxx11::u8string::u8string((u8string *)&local_cc0);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_ca0,(object *)local_c18,&local_cc0);
  std::__cxx11::u8string::u8string((u8string *)&local_ce0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((EqHelper *)local_c80,"obj.get<std::u8string>()","std::u8string{}",&local_ca0,
             &local_ce0);
  std::__cxx11::u8string::~u8string((u8string *)&local_ce0);
  std::__cxx11::u8string::~u8string((u8string *)&local_ca0);
  std::__cxx11::u8string::~u8string((u8string *)&local_cc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
  if (!bVar1) {
    testing::Message::Message(local_ce8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c80);
    testing::internal::AssertHelper::AssertHelper
              (local_cf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=(local_cf0,local_ce8);
    testing::internal::AssertHelper::~AssertHelper(local_cf0);
    testing::Message::~Message(local_ce8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
  jessilib::object::~object((object *)local_c18);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(bool);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(signed_char_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(unsigned_char_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(short);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(int);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long_long_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(intmax_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(float);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(double);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long_double_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::u8string);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(object::array_type);

	// const char*
	{
		object obj{ u8"" };
		EXPECT_TRUE(obj.has<std::u8string>());
		EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
	}

	// std::u8string_view
	{
		object obj{ u8""sv };
		EXPECT_TRUE(obj.has<std::u8string>());
		EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
	}
}